

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O0

char * err_string_lookup(uint32_t lib,uint32_t key,uint32_t *values,size_t num_values,
                        char *string_data)

{
  uint *puVar1;
  uint32_t *result;
  char *pcStack_30;
  uint32_t search_key;
  char *string_data_local;
  size_t num_values_local;
  uint32_t *values_local;
  uint32_t key_local;
  uint32_t lib_local;
  
  if ((lib < 0x40) && (key < 0x800)) {
    result._4_4_ = lib << 0x1a | key << 0xf;
    pcStack_30 = string_data;
    string_data_local = (char *)num_values;
    num_values_local = (size_t)values;
    values_local._0_4_ = key;
    values_local._4_4_ = lib;
    puVar1 = (uint *)bsearch((void *)((long)&result + 4),values,num_values,4,err_string_cmp);
    if (puVar1 == (uint *)0x0) {
      _key_local = (char *)0x0;
    }
    else {
      _key_local = pcStack_30 + (*puVar1 & 0x7fff);
    }
  }
  else {
    _key_local = (char *)0x0;
  }
  return _key_local;
}

Assistant:

static const char *err_string_lookup(uint32_t lib, uint32_t key,
                                     const uint32_t *values, size_t num_values,
                                     const char *string_data) {
  // |values| points to data in err_data.h, which is generated by
  // err_data_generate.go. It's an array of uint32_t values. Each value has the
  // following structure:
  //   | lib  |    key    |    offset     |
  //   |6 bits|  11 bits  |    15 bits    |
  //
  // The |lib| value is a library identifier: one of the |ERR_LIB_*| values.
  // The |key| is a reason code, depending on the context.
  // The |offset| is the number of bytes from the start of |string_data| where
  // the (NUL terminated) string for this value can be found.
  //
  // Values are sorted based on treating the |lib| and |key| part as an
  // unsigned integer.
  if (lib >= (1 << 6) || key >= (1 << 11)) {
    return NULL;
  }
  uint32_t search_key = lib << 26 | key << 15;
  const uint32_t *result = reinterpret_cast<const uint32_t *>(bsearch(
      &search_key, values, num_values, sizeof(uint32_t), err_string_cmp));
  if (result == NULL) {
    return NULL;
  }

  return &string_data[(*result) & 0x7fff];
}